

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_input_set_witness(wally_tx_input *input,wally_tx_witness_stack *stack)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  undefined1 free_parent;
  wally_tx_witness_stack *new_witness;
  wally_tx_witness_stack *local_18;
  wally_tx_witness_stack *pwVar4;
  
  local_18 = (wally_tx_witness_stack *)0x0;
  pwVar4 = stack;
  _Var1 = is_valid_tx_input(input);
  free_parent = SUB81(pwVar4,0);
  if (!_Var1) {
    return -2;
  }
  if (stack != (wally_tx_witness_stack *)0x0) {
    if (stack->items == (wally_tx_witness_item *)0x0 && stack->items_allocation_len == 0) {
      bVar3 = stack->num_items == 0;
    }
    else {
      bVar3 = (stack->items != (wally_tx_witness_item *)0x0) == (stack->items_allocation_len != 0);
    }
    if (!bVar3) {
      return -2;
    }
    free_parent = (char)&local_18;
    iVar2 = wally_tx_witness_stack_clone_alloc(stack,&local_18);
    if (iVar2 != 0) {
      return -3;
    }
  }
  tx_witness_stack_free(input->witness,(_Bool)free_parent);
  input->witness = local_18;
  return 0;
}

Assistant:

int wally_tx_input_set_witness(struct wally_tx_input *input,
                               const struct wally_tx_witness_stack *stack)
{
    struct wally_tx_witness_stack *new_witness = NULL;

    if (!is_valid_tx_input(input) || (stack && !is_valid_witness_stack(stack)))
        return WALLY_EINVAL;

    if (stack &&
        wally_tx_witness_stack_clone_alloc(stack, &new_witness) != WALLY_OK)
        return WALLY_ENOMEM;

    tx_witness_stack_free(input->witness, true);
    input->witness = new_witness;
    return WALLY_OK;
}